

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O1

void __thiscall encoder_Hx_basic_demo_Test::TestBody(encoder_Hx_basic_demo_Test *this)

{
  long lVar1;
  ostream *poVar2;
  array<bool,_2048UL> output;
  array<bool,_6144UL> input;
  vector<bool,_std::allocator<bool>_> local_2048;
  array<bool,_2048UL> local_2020;
  array<bool,_6144UL> local_1820;
  
  memset(&local_1820,0,0x1800);
  memset(&local_2020,0,0x800);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input nonzeros:\n",0x10)
  ;
  HelpersForTests::get_bitstring<bool>(&local_2048,0x1800);
  HelpersForTests::vec_to_arr<bool,6144ul>(&local_2048,&local_1820);
  if (local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_2048.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  HelpersForTests::print_nz_inds<std::array<bool,6144ul>>(&local_1820);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  LDPC4QKD::encode<bool>(&local_1820,&local_2020);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Syndrome nonzeros:\n",0x13);
  HelpersForTests::print_nz_inds<std::array<bool,2048ul>>(&local_2020);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Syndrome hash: ",0xf);
  lVar1 = 0;
  do {
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x800);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

TEST(encoder, Hx_basic_demo) {
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};

    std::cout << "------------------------\n";
    std::cout << "Input nonzeros:\n";
    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);
    // noise_bitstring_inplace(input, 0.5, seed);

    print_nz_inds(input);

    std::cout << "------------------------\n";

    encode(input, output);

    std::cout << "Syndrome nonzeros:\n";
    print_nz_inds(output);

    std::cout << "------------------------\n";

    std::cout << "Syndrome hash: " << hash_vector(output) << std::endl;
}